

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compile-time-kalman-filter.hxx
# Opt level: O3

StateVector * __thiscall
stateObservation::compileTime::KalmanFilter<4U,_3U,_2U>::prediction_
          (StateVector *__return_storage_ptr__,KalmanFilter<4U,_3U,_2U> *this,uint k)

{
  undefined1 auVar1 [16];
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  double dVar11;
  double dVar12;
  double dVar13;
  double dVar14;
  double dVar15;
  double dVar16;
  double dVar17;
  double dVar18;
  double dVar19;
  double dVar20;
  double dVar21;
  double dVar22;
  double dVar23;
  double dVar24;
  double dVar25;
  ulong uVar26;
  char *__function;
  long lVar27;
  ulong uVar28;
  _Elt_pointer pIVar29;
  
  if ((this->super_KalmanFilterBase<4U,_3U,_2U>).a_.isSet_ == false) {
    __function = 
    "void stateObservation::compileTime::IndexedMatrix<4, 4>::check_() const [r = 4, c = 4]";
    goto LAB_00113ed6;
  }
  if ((this->super_KalmanFilterBase<4U,_3U,_2U>).super_ZeroDelayObserver<4U,_3U,_2U>.x_.isSet_ ==
      false) {
    __function = 
    "void stateObservation::compileTime::IndexedMatrix<4, 1>::check_() const [r = 4, c = 1]";
    goto LAB_00113ed6;
  }
  dVar2 = *(double *)
           ((long)(this->super_KalmanFilterBase<4U,_3U,_2U>).a_.v_.
                  super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.
                  array + 8);
  dVar3 = *(double *)
           ((long)(this->super_KalmanFilterBase<4U,_3U,_2U>).a_.v_.
                  super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.
                  array + 0x10);
  dVar4 = *(double *)
           ((long)(this->super_KalmanFilterBase<4U,_3U,_2U>).a_.v_.
                  super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.
                  array + 0x18);
  dVar5 = *(double *)
           ((long)(this->super_KalmanFilterBase<4U,_3U,_2U>).a_.v_.
                  super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.
                  array + 0x28);
  dVar6 = *(double *)
           ((long)(this->super_KalmanFilterBase<4U,_3U,_2U>).a_.v_.
                  super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.
                  array + 0x30);
  dVar7 = *(double *)
           ((long)(this->super_KalmanFilterBase<4U,_3U,_2U>).a_.v_.
                  super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.
                  array + 0x38);
  dVar8 = *(double *)
           ((long)(this->super_KalmanFilterBase<4U,_3U,_2U>).a_.v_.
                  super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.
                  array + 0x48);
  dVar9 = *(double *)
           ((long)(this->super_KalmanFilterBase<4U,_3U,_2U>).a_.v_.
                  super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.
                  array + 0x50);
  dVar10 = *(double *)
            ((long)(this->super_KalmanFilterBase<4U,_3U,_2U>).a_.v_.
                   super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.
                   array + 0x58);
  dVar11 = *(double *)
            ((long)(this->super_KalmanFilterBase<4U,_3U,_2U>).a_.v_.
                   super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.
                   array + 0x68);
  dVar12 = *(double *)
            ((long)(this->super_KalmanFilterBase<4U,_3U,_2U>).a_.v_.
                   super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.
                   array + 0x70);
  dVar13 = *(double *)
            ((long)(this->super_KalmanFilterBase<4U,_3U,_2U>).a_.v_.
                   super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.
                   array + 0x78);
  dVar22 = (this->super_KalmanFilterBase<4U,_3U,_2U>).super_ZeroDelayObserver<4U,_3U,_2U>.x_.v_.
           super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.m_data.array[0];
  dVar23 = *(double *)
            ((long)&(this->super_KalmanFilterBase<4U,_3U,_2U>).super_ZeroDelayObserver<4U,_3U,_2U>.
                    x_.v_.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.
                    m_data + 8);
  dVar24 = *(double *)
            ((long)&(this->super_KalmanFilterBase<4U,_3U,_2U>).super_ZeroDelayObserver<4U,_3U,_2U>.
                    x_.v_.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.
                    m_data + 0x10);
  dVar25 = *(double *)
            ((long)&(this->super_KalmanFilterBase<4U,_3U,_2U>).super_ZeroDelayObserver<4U,_3U,_2U>.
                    x_.v_.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.
                    m_data + 0x18);
  if ((this->b_).isSet_ == false) {
    __function = 
    "void stateObservation::compileTime::IndexedMatrix<4, 2>::check_() const [r = 4, c = 2]";
    goto LAB_00113ed6;
  }
  pIVar29 = (this->super_KalmanFilterBase<4U,_3U,_2U>).super_ZeroDelayObserver<4U,_3U,_2U>.u_.
            super__Deque_base<stateObservation::compileTime::IndexedMatrix<2U,_1U>,_Eigen::aligned_allocator<stateObservation::compileTime::IndexedMatrix<2U,_1U>_>_>
            ._M_impl.super__Deque_impl_data._M_start._M_cur;
  lVar27 = (long)pIVar29 -
           (long)*(_Elt_pointer *)
                  ((long)&(this->super_KalmanFilterBase<4U,_3U,_2U>).
                          super_ZeroDelayObserver<4U,_3U,_2U>.u_.
                          super__Deque_base<stateObservation::compileTime::IndexedMatrix<2U,_1U>,_Eigen::aligned_allocator<stateObservation::compileTime::IndexedMatrix<2U,_1U>_>_>
                          ._M_impl.super__Deque_impl_data._M_start + 8);
  uVar26 = lVar27 >> 5;
  if ((long)uVar26 < 0) {
    uVar28 = lVar27 >> 9;
LAB_00113d83:
    pIVar29 = (*(_Map_pointer *)
                ((long)&(this->super_KalmanFilterBase<4U,_3U,_2U>).
                        super_ZeroDelayObserver<4U,_3U,_2U>.u_.
                        super__Deque_base<stateObservation::compileTime::IndexedMatrix<2U,_1U>,_Eigen::aligned_allocator<stateObservation::compileTime::IndexedMatrix<2U,_1U>_>_>
                        ._M_impl.super__Deque_impl_data._M_start + 0x18))[uVar28] +
              uVar26 + uVar28 * -0x10;
  }
  else if (0xf < uVar26) {
    uVar28 = uVar26 >> 4;
    goto LAB_00113d83;
  }
  if (pIVar29->isSet_ != false) {
    dVar14 = (this->b_).v_.super_PlainObjectBase<Eigen::Matrix<double,_4,_2,_0,_4,_2>_>.m_storage.
             m_data.array[2];
    dVar15 = (this->b_).v_.super_PlainObjectBase<Eigen::Matrix<double,_4,_2,_0,_4,_2>_>.m_storage.
             m_data.array[3];
    dVar16 = (this->b_).v_.super_PlainObjectBase<Eigen::Matrix<double,_4,_2,_0,_4,_2>_>.m_storage.
             m_data.array[6];
    dVar17 = (this->b_).v_.super_PlainObjectBase<Eigen::Matrix<double,_4,_2,_0,_4,_2>_>.m_storage.
             m_data.array[7];
    dVar18 = (pIVar29->v_).super_PlainObjectBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>.m_storage.
             m_data.array[0];
    dVar19 = (pIVar29->v_).super_PlainObjectBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>.m_storage.
             m_data.array[1];
    dVar20 = (this->b_).v_.super_PlainObjectBase<Eigen::Matrix<double,_4,_2,_0,_4,_2>_>.m_storage.
             m_data.array[1];
    dVar21 = (this->b_).v_.super_PlainObjectBase<Eigen::Matrix<double,_4,_2,_0,_4,_2>_>.m_storage.
             m_data.array[5];
    (__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>).m_storage
    .m_data.array[0] =
         (this->b_).v_.super_PlainObjectBase<Eigen::Matrix<double,_4,_2,_0,_4,_2>_>.m_storage.m_data
         .array[4] * dVar19 +
         (this->b_).v_.super_PlainObjectBase<Eigen::Matrix<double,_4,_2,_0,_4,_2>_>.m_storage.m_data
         .array[0] * dVar18 +
         *(double *)
          ((long)(this->super_KalmanFilterBase<4U,_3U,_2U>).a_.v_.
                 super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array
          + 0x60) * dVar25 +
         *(double *)
          ((long)(this->super_KalmanFilterBase<4U,_3U,_2U>).a_.v_.
                 super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array
          + 0x40) * dVar24 +
         *(double *)
          ((long)(this->super_KalmanFilterBase<4U,_3U,_2U>).a_.v_.
                 super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array
          + 0x20) * dVar23 +
         (this->super_KalmanFilterBase<4U,_3U,_2U>).a_.v_.
         super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array[0] *
         dVar22;
    (__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>).m_storage
    .m_data.array[1] =
         dVar21 * dVar19 + dVar20 * dVar18 +
         dVar11 * dVar25 + dVar8 * dVar24 + dVar5 * dVar23 + dVar2 * dVar22;
    dVar2 = dVar19 * dVar17 + dVar18 * dVar15 +
            dVar25 * dVar13 + dVar24 * dVar10 + dVar23 * dVar7 + dVar22 * dVar4;
    auVar1._8_4_ = SUB84(dVar2,0);
    auVar1._0_8_ = dVar19 * dVar16 + dVar18 * dVar14 +
                   dVar25 * dVar12 + dVar24 * dVar9 + dVar23 * dVar6 + dVar22 * dVar3;
    auVar1._12_4_ = (int)((ulong)dVar2 >> 0x20);
    *(undefined1 (*) [16])
     ((__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>).
      m_storage.m_data.array + 2) = auVar1;
    return __return_storage_ptr__;
  }
  __function = 
  "void stateObservation::compileTime::IndexedMatrix<2, 1>::check_() const [r = 2, c = 1]";
LAB_00113ed6:
  __assert_fail("isSet_ && \"Error : Matrix not initialized\"",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/stack-of-tasks[P]state-observation/include/state-observation/observer/compile-time/compile-time-observer-base.hxx"
                ,0x3e,__function);
}

Assistant:

typename ObserverBase<n,m,p>::StateVector KalmanFilter<n,m,p>::prediction_(unsigned k)
{
    (void)k; //unused

    if (p>0)
        return this->a_()*this->x_()+this->b_()*this->u_[0]();
    else
        return typename ObserverBase<n,m,p>::StateVector(this->a_()*this->x_());

}